

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)201>(Result *__return_storage_ptr__,Model *pipeline)

{
  PipelineRegressor *this;
  Pipeline *pipelineParams_00;
  Pipeline *pipelineParams;
  Model *pipeline_local;
  
  this = Specification::Model::pipelineregressor(pipeline);
  pipelineParams_00 = Specification::PipelineRegressor::pipeline(this);
  validate(__return_storage_ptr__,pipeline,pipelineParams_00);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_pipelineRegressor>(const Specification::Model& pipeline) {
        const auto& pipelineParams = pipeline.pipelineregressor().pipeline();
        // TODO -- validate regressor interface
        return validate(pipeline, pipelineParams);
    }